

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddFuncs.c
# Opt level: O3

DdNode * cuddZddDivideF(DdManager *dd,DdNode *f,DdNode *g)

{
  DdHalfWord v;
  DdNode *pDVar1;
  int iVar2;
  DdNode *pDVar3;
  DdNode *n;
  DdNode *n_00;
  DdNode *g1;
  DdNode *g0;
  DdNode *f1;
  DdNode *f0;
  DdNode *local_50;
  DdNode *local_48;
  DdNode *local_40;
  DdNode *local_38;
  
  pDVar3 = dd->one;
  if (pDVar3 == g) {
    return f;
  }
  pDVar1 = dd->zero;
  if (pDVar3 == f || pDVar1 == f) {
    return pDVar1;
  }
  if (f == g) {
    return pDVar3;
  }
  pDVar3 = cuddCacheLookup2Zdd(dd,cuddZddDivideF,f,g);
  if (pDVar3 != (DdNode *)0x0) {
    return pDVar3;
  }
  v = g->index;
  iVar2 = cuddZddGetCofactors2(dd,f,v,&local_40,&local_38);
  if (iVar2 != 0) {
    return (DdNode *)0x0;
  }
  Cudd_Ref(local_40);
  Cudd_Ref(local_38);
  iVar2 = cuddZddGetCofactors2(dd,g,v,&local_50,&local_48);
  pDVar3 = local_38;
  if (iVar2 == 0) {
    Cudd_Ref(local_50);
    Cudd_Ref(local_48);
    n = cuddZddDivideF(dd,local_40,local_50);
    if (n == (DdNode *)0x0) {
      Cudd_RecursiveDerefZdd(dd,local_40);
      Cudd_RecursiveDerefZdd(dd,local_38);
      Cudd_RecursiveDerefZdd(dd,local_50);
      goto LAB_007a7ad5;
    }
    Cudd_Ref(n);
    n_00 = n;
    if (local_48 == pDVar1 || n == pDVar1) {
LAB_007a7bbe:
      Cudd_RecursiveDerefZdd(dd,local_40);
      Cudd_RecursiveDerefZdd(dd,local_38);
      Cudd_RecursiveDerefZdd(dd,local_50);
      Cudd_RecursiveDerefZdd(dd,local_48);
      cuddCacheInsert2(dd,cuddZddDivideF,f,g,n_00);
      Cudd_Deref(n_00);
      return n_00;
    }
    pDVar3 = cuddZddDivideF(dd,local_38,local_48);
    if (pDVar3 == (DdNode *)0x0) {
      Cudd_RecursiveDerefZdd(dd,local_40);
      Cudd_RecursiveDerefZdd(dd,local_38);
      Cudd_RecursiveDerefZdd(dd,local_50);
      goto LAB_007a7ad5;
    }
    Cudd_Ref(pDVar3);
    n_00 = cuddZddIntersect(dd,n,pDVar3);
    if (n_00 != (DdNode *)0x0) {
      Cudd_Ref(n_00);
      Cudd_RecursiveDerefZdd(dd,pDVar3);
      Cudd_RecursiveDerefZdd(dd,n);
      goto LAB_007a7bbe;
    }
    Cudd_RecursiveDerefZdd(dd,local_40);
    Cudd_RecursiveDerefZdd(dd,local_38);
    Cudd_RecursiveDerefZdd(dd,local_50);
    local_40 = local_48;
  }
  Cudd_RecursiveDerefZdd(dd,local_40);
  local_48 = pDVar3;
LAB_007a7ad5:
  Cudd_RecursiveDerefZdd(dd,local_48);
  return (DdNode *)0x0;
}

Assistant:

DdNode  *
cuddZddDivideF(
  DdManager * dd,
  DdNode * f,
  DdNode * g)
{
    int         v;
    DdNode      *one = DD_ONE(dd);
    DdNode      *zero = DD_ZERO(dd);
    DdNode      *f0, *f1, *g0, *g1;
    DdNode      *q, *r, *tmp;
    int         flag;

    statLine(dd);
    if (g == one)
        return(f);
    if (f == zero || f == one)
        return(zero);
    if (f == g)
        return(one);

    /* Check cache. */
    r = cuddCacheLookup2Zdd(dd, cuddZddDivideF, f, g);
    if (r)
        return(r);

    v = g->index;

    flag = cuddZddGetCofactors2(dd, f, v, &f1, &f0);
    if (flag == 1)
        return(NULL);
    Cudd_Ref(f1);
    Cudd_Ref(f0);
    flag = cuddZddGetCofactors2(dd, g, v, &g1, &g0);    /* g1 != zero */
    if (flag == 1) {
        Cudd_RecursiveDerefZdd(dd, f1);
        Cudd_RecursiveDerefZdd(dd, f0);
        return(NULL);
    }
    Cudd_Ref(g1);
    Cudd_Ref(g0);

    r = cuddZddDivideF(dd, f1, g1);
    if (r == NULL) {
        Cudd_RecursiveDerefZdd(dd, f1);
        Cudd_RecursiveDerefZdd(dd, f0);
        Cudd_RecursiveDerefZdd(dd, g1);
        Cudd_RecursiveDerefZdd(dd, g0);
        return(NULL);
    }
    Cudd_Ref(r);

    if (r != zero && g0 != zero) {
        tmp = r;
        q = cuddZddDivideF(dd, f0, g0);
        if (q == NULL) {
            Cudd_RecursiveDerefZdd(dd, f1);
            Cudd_RecursiveDerefZdd(dd, f0);
            Cudd_RecursiveDerefZdd(dd, g1);
            Cudd_RecursiveDerefZdd(dd, g0);
            return(NULL);
        }
        Cudd_Ref(q);
        r = cuddZddIntersect(dd, r, q);
        if (r == NULL) {
            Cudd_RecursiveDerefZdd(dd, f1);
            Cudd_RecursiveDerefZdd(dd, f0);
            Cudd_RecursiveDerefZdd(dd, g1);
            Cudd_RecursiveDerefZdd(dd, g0);
            Cudd_RecursiveDerefZdd(dd, q);
            return(NULL);
        }
        Cudd_Ref(r);
        Cudd_RecursiveDerefZdd(dd, q);
        Cudd_RecursiveDerefZdd(dd, tmp);
    }

    Cudd_RecursiveDerefZdd(dd, f1);
    Cudd_RecursiveDerefZdd(dd, f0);
    Cudd_RecursiveDerefZdd(dd, g1);
    Cudd_RecursiveDerefZdd(dd, g0);
    
    cuddCacheInsert2(dd, cuddZddDivideF, f, g, r);
    Cudd_Deref(r);
    return(r);

}